

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

void __thiscall
USBControlTransferParser::ParseDataPacket(USBControlTransferParser *this,USBPacket *packet)

{
  byte bVar1;
  undefined1 uVar2;
  USBAnalyzerResults *pUVar3;
  bool bVar4;
  bool bVar5;
  USBClassCodes UVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  int iVar9;
  int offset;
  Frame aFStack_58 [40];
  
  this->pPacket = packet;
  this->mPacketOffset = 0;
  this->mPacketDataBytes =
       (*(int *)&(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) + -4;
  bVar1 = (this->mRequest).bmRequestType;
  bVar4 = (this->mRequest).bRequest == '\x06';
  bVar5 = (bVar1 & 0x60) == 0;
  if (bVar4 && bVar5) {
    if ((*(int *)&(this->mRequest).wValue - 0x100U & 0xffff) < 0x800) {
      do {
        if (this->mPacketDataBytes <= this->mPacketOffset) {
          return;
        }
        pmVar7 = std::
                 map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                 ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
        uVar2 = (undefined1)*pmVar7;
        iVar9 = this->mParsedOffset;
        offset = (int)packet;
        if (iVar9 == 2) {
          if (((uVar2 & (CC_WirelessController|CC_AudioVideo|CC_Printer)) ==
               CC_CommunicationsAndCDCControl) &&
             ((this->mDescType & ~DT_DEVICE) == DT_CDC_CS_INTERFACE)) {
            this->mDescSubtype =
                 (uint)(packet->mData).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)this->mPacketOffset + 2];
            pUVar3 = this->pResults;
            USBPacket::GetDataPayloadField
                      ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                       (char *)(ulong)this->mAddress,0x13c573,'\x1f');
            AnalyzerResults::AddFrame((Frame *)pUVar3);
LAB_001355d2:
            Frame::~Frame(aFStack_58);
            this->mPacketOffset = this->mPacketOffset + 1;
            goto LAB_001355dd;
          }
LAB_001354e1:
          if (this->mDescType != DT_STRING) {
            ParseStandardDescriptor(this);
            goto LAB_001355e0;
          }
          bVar5 = ParseStringDescriptor(this);
          iVar9 = 0;
          bVar4 = true;
          if ((bVar5) && (this->mPacketOffset < this->mPacketDataBytes)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "String descriptor length shorter than packet length. Packet length: ",0x44);
            poVar8 = (ostream *)
                     std::ostream::operator<<((ostream *)&std::cerr,this->mPacketDataBytes);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," processed bytes: ",0x12);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mPacketOffset);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," reported descriptor length: ",0x1d);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mDescBytes);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            iVar9 = 3;
            bVar4 = false;
          }
          if (bVar4) goto LAB_001355e0;
        }
        else {
          if (iVar9 == 1) {
            iVar9 = this->mPacketOffset;
            bVar1 = (packet->mData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)iVar9 + 2];
            this->mDescType = (uint)bVar1;
            if ((((byte)(bVar1 - 1) < 8) ||
                ((uVar2 & CC_ApplicationSpecific) == CC_CommunicationsAndCDCControl)) ||
               (uVar2 == CC_CDCData)) {
              pUVar3 = this->pResults;
              USBPacket::GetDataPayloadField
                        ((USBPacket *)aFStack_58,offset,iVar9,'\x01',(char *)(ulong)this->mAddress,
                         0x13c551,'\x0f');
              AnalyzerResults::AddFrame((Frame *)pUVar3);
            }
            else {
              pUVar3 = this->pResults;
              USBPacket::GetDataPayloadField
                        ((USBPacket *)aFStack_58,offset,iVar9,'\x01',(char *)(ulong)this->mAddress,
                         0x13c551,'\x10');
              AnalyzerResults::AddFrame((Frame *)pUVar3);
            }
            goto LAB_001355d2;
          }
          if (iVar9 != 0) goto LAB_001354e1;
          pUVar3 = this->pResults;
          USBPacket::GetDataPayloadField
                    ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                     (char *)(ulong)this->mAddress,0x13cba8,'\0');
          AnalyzerResults::AddFrame((Frame *)pUVar3);
          Frame::~Frame(aFStack_58);
          this->mDescBytes =
               (uint)(packet->mData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)this->mPacketOffset + 2];
          this->mPacketOffset = this->mPacketOffset + 1;
LAB_001355dd:
          this->mParsedOffset = this->mParsedOffset + 1;
LAB_001355e0:
          iVar9 = 0;
        }
        if (iVar9 != 0) {
          return;
        }
      } while( true );
    }
    if ((bVar4 && bVar5) && (*(char *)((long)&(this->mRequest).wValue + 1) == '\"')) {
      ParseHIDReportDescriptor(this);
      return;
    }
  }
  if (((bVar1 & 0x7f) == 0x21) &&
     (UVar6 = GetClassCodeForInterface(this,(U8)(this->mRequest).wValue),
     (UVar6 & ~CC_MassStorage) == CC_CommunicationsAndCDCControl)) {
    ParseCDCDataStage(this);
    return;
  }
  ParseUnknownResponse(this);
  return;
}

Assistant:

void USBControlTransferParser::ParseDataPacket( USBPacket& packet )
{
    pPacket = &packet;
    mPacketOffset = 0;
    mPacketDataBytes = packet.mData.size() - 4;

    if( mRequest.IsRequestedStandardDescriptor() )
    {
        while( mPacketDataBytes > mPacketOffset )
        {
            U8 interfaceClass = mInterfaceClasses[ mInterfaceNumber ];

            if( mParsedOffset == 0 ) // are we just starting with this descriptor?
            {
                // handle the bLength field
                pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bLength", Fld_None, FF_DataDescriptor ) );
                mDescBytes = packet.GetDataPayload( mPacketOffset, 1 );
                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 1 )
            {
                mDescType = USBDescriptorType( packet.GetDataPayload( mPacketOffset, 1 ) );

                if( IsStandardDescriptor( mDescType ) || interfaceClass == CC_HID || interfaceClass == CC_CommunicationsAndCDCControl ||
                    interfaceClass == CC_CDCData )
                    pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType ) );
                else
                    pResults->AddFrame(
                        packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType_Other ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 2 && ( interfaceClass == CC_CommunicationsAndCDCControl || interfaceClass == CC_CDCData ) &&
                     ( mDescType == DT_CDC_CS_INTERFACE || mDescType == DT_CDC_CS_ENDPOINT ) )
            {
                mDescSubtype = USBCDCDescriptorSubtype( packet.GetDataPayload( mPacketOffset, 1 ) );
                pResults->AddFrame(
                    packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorSubtype", Fld_CDC_DescriptorSubtype ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else
            {
                if( mDescType == DT_STRING )
                {
                    bool detected_complete_descriptor = ParseStringDescriptor();
                    if( detected_complete_descriptor && mPacketDataBytes > mPacketOffset )
                    {
                        // we finished parsing the complete string descriptor, according to bLength, however there are still bytes left in
                        // the packet.
                        std::cerr << "String descriptor length shorter than packet length. Packet length: " << mPacketDataBytes
                                  << " processed bytes: " << mPacketOffset << " reported descriptor length: " << mDescBytes << "\n";
                        break;
                    }
                }
                else
                {
                    ParseStandardDescriptor();
                }
            }
        }
    }
    else if( mRequest.IsRequestedHIDReportDescriptor() )
    {
        ParseHIDReportDescriptor();
    }
    else if( IsCDCClassRequest() )
    {
        ParseCDCDataStage();
    }
    else
    {
        ParseUnknownResponse();
    }
}